

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O1

void * mpp_dec_hal_thread(void *data)

{
  RK_S32 index_00;
  MppDec ctx;
  MppDec ctx_00;
  HalTaskGroup group;
  HalDecTaskFlag flags;
  HalDecTaskFlag flags_00;
  HalDecTaskFlag flags_01;
  MppThreadStatus MVar1;
  MPP_RET MVar2;
  HalDecTaskFlag flags_02;
  int iVar3;
  undefined4 index_01;
  MppBufSlots pvVar4;
  long lVar5;
  MppThread *this;
  RK_U32 flag;
  pthread_mutex_t *__mutex;
  HalTaskHnd task;
  RK_S32 index;
  HalTaskInfo task_info;
  HalTaskHnd local_100;
  RK_S32 local_f4;
  HalTaskHnd local_f0;
  MppThread *local_e8;
  pthread_mutex_t *local_e0;
  MppBufSlots local_d8;
  MppBufSlots local_d0;
  pthread_cond_t *local_c8;
  sem_t *local_c0;
  HalTaskGroup local_b8;
  HalTaskInfo local_b0;
  
  ctx = *(MppDec *)((long)data + 0xa8);
  this = *(MppThread **)((long)ctx + 0x28);
  pvVar4 = *(MppBufSlots *)((long)ctx + 0x30);
  local_b8 = *(HalTaskGroup *)((long)ctx + 0x78);
  local_d8 = *(MppBufSlots *)((long)ctx + 0x38);
  local_100 = (HalTaskHnd)0x0;
  mpp_clock_start(*(MppClock *)((long)ctx + 0x260));
  local_e0 = (pthread_mutex_t *)this->mMutexCond;
  local_c0 = (sem_t *)((long)ctx + 0x1d8);
  local_c8 = (pthread_cond_t *)&this->mMutexCond[0].mCondition;
  __mutex = local_e0;
  local_e8 = this;
  local_d0 = pvVar4;
  do {
    do {
      while( true ) {
        pthread_mutex_lock(__mutex);
        MVar1 = MppThread::get_status(this,THREAD_WORK);
        iVar3 = 3;
        if (MVar1 == MPP_THREAD_RUNNING) {
          MVar2 = hal_task_get_hnd(local_b8,1,&local_100);
          if (MVar2 == MPP_OK) {
            iVar3 = 0;
          }
          else if (*(int *)((long)ctx + 0x1ac) == *(int *)((long)ctx + 0x1b0)) {
            mpp_dec_notify(ctx,0x80);
            mpp_clock_start(*(MppClock *)((long)ctx + 0x268));
            MVar1 = this->mStatus[0];
            this->mStatus[0] = MPP_THREAD_WAITING;
            pthread_cond_wait(local_c8,__mutex);
            if (this->mStatus[0] == MPP_THREAD_WAITING) {
              this->mStatus[0] = MVar1;
            }
            mpp_clock_pause(*(MppClock *)((long)ctx + 0x268));
            iVar3 = 2;
          }
          else {
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: hal reset start\n",(char *)0x0);
            }
            ctx_00 = *(MppDec *)((long)data + 0xa8);
            pvVar4 = *(MppBufSlots *)((long)ctx_00 + 0x30);
            group = *(HalTaskGroup *)((long)ctx_00 + 0x78);
            local_f4 = -1;
            local_f0 = (HalTaskHnd)0x0;
            mpp_dec_flush(ctx_00);
            pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)ctx_00 + 0x28) + 0xb8));
            while (MVar2 = mpp_buf_slot_dequeue(pvVar4,&local_f4,QUEUE_DISPLAY), MVar2 == MPP_OK) {
              mpp_dec_put_frame((Mpp *)data,local_f4,(HalDecTaskFlag)0x0);
              mpp_buf_slot_clr_flag(pvVar4,local_f4,SLOT_QUEUE_USE);
            }
            MVar2 = hal_task_get_hnd(group,2,&local_f0);
            pvVar4 = local_d0;
            while (MVar2 == MPP_OK) {
              if (local_f0 != (HalTaskHnd)0x0) {
                hal_task_hnd_set_status(local_f0,0);
                local_f0 = (HalTaskHnd)0x0;
              }
              MVar2 = hal_task_get_hnd(group,2,&local_f0);
            }
            pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)ctx_00 + 0x28) + 0xb8));
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: hal reset done\n",(char *)0x0);
            }
            *(int *)((long)ctx + 0x1b0) = *(int *)((long)ctx + 0x1b0) + 1;
            sem_post(local_c0);
            iVar3 = 2;
            this = local_e8;
            __mutex = local_e0;
          }
        }
        pthread_mutex_unlock(__mutex);
        if (iVar3 == 0) break;
        if (iVar3 != 2) {
          mpp_clock_pause(*(MppClock *)((long)ctx + 0x260));
          if ((*(int *)((long)data + 0x30) != *(int *)((long)data + 0x34)) &&
             (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "mpp->mTaskPutCount == mpp->mTaskGetCount","mpp_dec_hal_thread",0x38d),
             (mpp_debug._3_1_ & 0x10) != 0)) {
            abort();
          }
          if (((byte)mpp_debug & 4) != 0) {
            _mpp_log_l(4,"mpp_dec","mpp_dec_hal_thread exited\n",(char *)0x0);
          }
          return (void *)0x0;
        }
      }
    } while (local_100 == (HalTaskHnd)0x0);
    mpp_clock_start(*(MppClock *)((long)ctx + 0x270));
    *(int *)((long)data + 0x34) = *(int *)((long)data + 0x34) + 1;
    hal_task_hnd_get_info(local_100,&local_b0);
    flags.val._1_7_ = local_b0._9_7_;
    flags.val._0_1_ = local_b0._8_1_;
    if ((local_b0._8_1_ & 2) == 0) {
      if (((local_b0._8_1_ & 1) != 0) && ((local_b0.dec.valid == 0 || (local_b0.dec.output < 0)))) {
        mpp_dec_push_display((Mpp *)data,flags);
        flags_02.val._1_7_ = local_b0._9_7_;
        flags_02.val._0_1_ = local_b0._8_1_;
        index_01 = -1;
        goto LAB_00147f3e;
      }
      mpp_clock_start(*(MppClock *)((long)ctx + 0x278));
      mpp_hal_hw_wait(*(MppHal *)((long)ctx + 0x18),&local_b0);
      mpp_clock_pause(*(MppClock *)((long)ctx + 0x278));
      *(int *)((long)ctx + 0x284) = *(int *)((long)ctx + 0x284) + 1;
      mpp_buf_slot_clr_flag(local_d8,local_b0.dec.input,SLOT_HAL_INPUT);
      hal_task_hnd_set_status(local_100,(uint)(*(int *)((long)ctx + 0x1f8) == 0) * 2);
      iVar3 = *(int *)((long)ctx + 0x1f8);
      local_100 = (HalTaskHnd)0x0;
      if (-1 < local_b0.dec.output) {
        mpp_buf_slot_clr_flag(pvVar4,local_b0.dec.output,SLOT_HAL_OUTPUT);
      }
      flag = (uint)(iVar3 == 0) << 9 | 0x100;
      lVar5 = 0xe;
      do {
        index_00 = *(RK_S32 *)((long)&local_b0 + lVar5 * 4);
        if (-1 < index_00) {
          mpp_buf_slot_clr_flag(pvVar4,index_00,SLOT_HAL_INPUT);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x1f);
      if ((local_b0._8_1_ & 1) != 0) {
        mpp_dec_flush(ctx);
      }
      flags_00.val._1_7_ = local_b0._9_7_;
      flags_00.val._0_1_ = local_b0._8_1_;
      mpp_dec_push_display((Mpp *)data,flags_00);
      this = local_e8;
    }
    else {
      mpp_dec_flush(ctx);
      flags_01.val._1_7_ = local_b0._9_7_;
      flags_01.val._0_1_ = local_b0._8_1_;
      mpp_dec_push_display((Mpp *)data,flags_01);
      flags_02.val._1_7_ = local_b0._9_7_;
      flags_02.val._0_1_ = local_b0._8_1_;
      index_01 = local_b0.dec.output;
LAB_00147f3e:
      mpp_dec_put_frame((Mpp *)data,index_01,flags_02);
      hal_task_hnd_set_status(local_100,0);
      local_100 = (HalTaskHnd)0x0;
      flag = 0x100;
    }
    mpp_dec_notify(ctx,flag);
    mpp_clock_pause(*(MppClock *)((long)ctx + 0x270));
    __mutex = local_e0;
  } while( true );
}

Assistant:

void *mpp_dec_hal_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *hal = dec->thread_hal;
    HalTaskGroup tasks = dec->tasks;
    MppBufSlots frame_slots = dec->frame_slots;
    MppBufSlots packet_slots = dec->packet_slots;

    HalTaskHnd  task = NULL;
    HalTaskInfo task_info;
    HalDecTask  *task_dec = &task_info.dec;

    mpp_clock_start(dec->clocks[DEC_HAL_TOTAL]);

    while (1) {
        /* hal thread wait for dxva interface intput first */
        {
            AutoMutex work_lock(hal->mutex());
            if (MPP_THREAD_RUNNING != hal->get_status())
                break;

            if (hal_task_get_hnd(tasks, TASK_PROCESSING, &task)) {
                // process all task then do reset process
                if (dec->hal_reset_post != dec->hal_reset_done) {
                    dec_dbg_reset("reset: hal reset start\n");
                    reset_hal_thread(mpp);
                    dec_dbg_reset("reset: hal reset done\n");
                    dec->hal_reset_done++;
                    sem_post(&dec->hal_reset);
                    continue;
                }

                mpp_dec_notify(dec, MPP_DEC_NOTIFY_TASK_ALL_DONE);
                mpp_clock_start(dec->clocks[DEC_HAL_WAIT]);
                hal->wait();
                mpp_clock_pause(dec->clocks[DEC_HAL_WAIT]);
                continue;
            }
        }

        if (task) {
            RK_U32 notify_flag = MPP_DEC_NOTIFY_TASK_HND_VALID;

            mpp_clock_start(dec->clocks[DEC_HAL_PROC]);
            mpp->mTaskGetCount++;

            hal_task_hnd_get_info(task, &task_info);

            /*
             * check info change flag
             * if this is a frame with that flag, only output an empty
             * MppFrame without any image data for info change.
             */
            if (task_dec->flags.info_change) {
                mpp_dec_flush(dec);
                mpp_dec_push_display(mpp, task_dec->flags);
                mpp_dec_put_frame(mpp, task_dec->output, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }
            /*
             * check eos task
             * if this task is invalid while eos flag is set, we will
             * flush display queue then push the eos frame to info that
             * all frames have decoded.
             */
            if (task_dec->flags.eos &&
                (!task_dec->valid || task_dec->output < 0)) {
                mpp_dec_push_display(mpp, task_dec->flags);
                /*
                 * Use -1 as invalid buffer slot index.
                 * Reason: the last task maybe is a empty task with eos flag
                 * only but this task may go through vproc process also. We need
                 * create a buffer slot index for it.
                 */
                mpp_dec_put_frame(mpp, -1, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }

            mpp_clock_start(dec->clocks[DEC_HW_WAIT]);
            mpp_hal_hw_wait(dec->hal, &task_info);
            mpp_clock_pause(dec->clocks[DEC_HW_WAIT]);
            dec->dec_hw_run_count++;

            /*
             * when hardware decoding is done:
             * 1. clear decoding flag (mark buffer is ready)
             * 2. use get_display to get a new frame with buffer
             * 3. add frame to output list
             * repeat 2 and 3 until not frame can be output
             */
            mpp_buf_slot_clr_flag(packet_slots, task_dec->input,
                                  SLOT_HAL_INPUT);

            hal_task_hnd_set_status(task, (dec->parser_fast_mode) ?
                                    (TASK_IDLE) : (TASK_PROC_DONE));

            if (dec->parser_fast_mode)
                notify_flag |= MPP_DEC_NOTIFY_TASK_HND_VALID;
            else
                notify_flag |= MPP_DEC_NOTIFY_TASK_PREV_DONE;

            task = NULL;

            if (task_dec->output >= 0)
                mpp_buf_slot_clr_flag(frame_slots, task_dec->output, SLOT_HAL_OUTPUT);

            for (RK_U32 i = 0; i < MPP_ARRAY_ELEMS(task_dec->refer); i++) {
                RK_S32 index = task_dec->refer[i];
                if (index >= 0)
                    mpp_buf_slot_clr_flag(frame_slots, index, SLOT_HAL_INPUT);
            }
            if (task_dec->flags.eos)
                mpp_dec_flush(dec);
            mpp_dec_push_display(mpp, task_dec->flags);

            mpp_dec_notify(dec, notify_flag);
            mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
        }
    }

    mpp_clock_pause(dec->clocks[DEC_HAL_TOTAL]);

    mpp_assert(mpp->mTaskPutCount == mpp->mTaskGetCount);
    mpp_dbg_info("mpp_dec_hal_thread exited\n");
    return NULL;
}